

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetadataTree.cpp
# Opt level: O0

Node * __thiscall
cali::internal::MetadataTree::get_path
          (MetadataTree *this,Attribute *attr,size_t n,Variant *data,Node *parent)

{
  bool bVar1;
  __pointer_type pGVar2;
  cali_id_t attr_00;
  byte local_59;
  Node *local_58;
  ulong local_48;
  size_t i;
  size_t base;
  Node *node;
  Node *parent_local;
  Variant *data_local;
  size_t n_local;
  Attribute *attr_local;
  MetadataTree *this_local;
  
  local_58 = parent;
  if (parent == (Node *)0x0) {
    pGVar2 = std::atomic<cali::internal::MetadataTree::GlobalData_*>::load(&mG,memory_order_seq_cst)
    ;
    local_58 = &pGVar2->root;
  }
  base = (size_t)local_58;
  i = 0;
  node = parent;
  for (local_48 = 0; local_48 < n; local_48 = local_48 + 1) {
    node = (Node *)base;
    base = (size_t)util::LockfreeIntrusiveTree<cali::Node>::first_child
                             ((LockfreeIntrusiveTree<cali::Node> *)base);
    while( true ) {
      local_59 = 0;
      if (base != 0) {
        attr_00 = Attribute::id(attr);
        bVar1 = Node::equals((Node *)base,attr_00,data + local_48);
        local_59 = bVar1 ^ 0xff;
      }
      if ((local_59 & 1) == 0) break;
      base = (size_t)util::LockfreeIntrusiveTree<cali::Node>::next_sibling
                               ((LockfreeIntrusiveTree<cali::Node> *)base);
    }
    if (base == 0) break;
    i = i + 1;
  }
  if (base == 0) {
    base = (size_t)create_path(this,attr,n - i,data + i,node);
  }
  return (Node *)base;
}

Assistant:

Node* MetadataTree::get_path(const Attribute& attr, size_t n, const Variant* data, Node* parent = nullptr)
{
    Node*  node = parent ? parent : &(mG.load()->root);
    size_t base = 0;

    for (size_t i = 0; i < n; ++i) {
        parent = node;

        for (node = parent->first_child(); node && !node->equals(attr.id(), data[i]); node = node->next_sibling())
            ;

        if (!node)
            break;

        ++base;
    }

    if (!node)
        node = create_path(attr, n - base, data + base, parent);

    return node;
}